

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

jpeg_scan_info * fill_scans(jpeg_scan_info *scanptr,int ncomps,int Ss,int Se,int Ah,int Al)

{
  int iVar1;
  
  iVar1 = 0;
  if (ncomps < 1) {
    ncomps = iVar1;
  }
  for (; ncomps != iVar1; iVar1 = iVar1 + 1) {
    scanptr->comps_in_scan = 1;
    scanptr->component_index[0] = iVar1;
    scanptr->Ss = Ss;
    scanptr->Se = Se;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr = scanptr + 1;
  }
  return scanptr;
}

Assistant:

LOCAL(jpeg_scan_info *)
fill_scans (jpeg_scan_info * scanptr, int ncomps,
	    int Ss, int Se, int Ah, int Al)
/* Support routine: generate one scan for each component */
{
  int ci;

  for (ci = 0; ci < ncomps; ci++) {
    scanptr->comps_in_scan = 1;
    scanptr->component_index[0] = ci;
    scanptr->Ss = Ss;
    scanptr->Se = Se;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr++;
  }
  return scanptr;
}